

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void writeFile(bool perspectiveCorrection)

{
  double *pdVar1;
  double dVar2;
  byte bVar3;
  int iVar4;
  tm *ptVar5;
  long lVar6;
  ostream *poVar7;
  reference __in;
  size_type sVar8;
  reference pt;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  __type _Var13;
  __type _Var14;
  double dVar15;
  _InputArray local_9a0;
  _InputArray local_988;
  Scalar_<double> local_970;
  Point_ local_950 [8];
  Point_ local_948 [8];
  _InputOutputArray local_940;
  Scalar_<double> local_928;
  Point_<double> local_908;
  Point_ local_8f8 [8];
  Point_<double> local_8f0;
  Point_ local_8e0 [8];
  _InputOutputArray local_8d8;
  Point_<double> local_8c0;
  double local_8b0;
  double theta;
  double rr;
  double yy;
  double xx;
  undefined1 local_860 [8];
  unique_lock<std::mutex> lock_1;
  undefined1 local_848 [8];
  unique_lock<std::mutex> lock;
  float Rgood;
  int maxNum;
  int innerCountMax;
  double sumTheta;
  double *lastMax;
  double next [3];
  double current [3];
  double last [3];
  int Nmassi;
  int npts;
  float yCenter;
  float xCenter;
  double dem;
  double num;
  double new_position_y;
  double new_position_x;
  string local_788 [39];
  allocator local_761;
  string local_760 [32];
  undefined1 local_740 [8];
  Point2d lastPoint;
  Mat extracted_Mat_X;
  queue<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::deque<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>_>
  *local_6d0;
  queue<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::deque<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>_>
  *resultQueue_X;
  double pos_Y;
  double pos_X;
  double elapsed_X;
  ostream local_6a8 [4];
  int frameNumber_X;
  ofstream txt_file_Y;
  ostream local_4a8 [8];
  ofstream txt_file;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [8];
  string file_name;
  string local_248 [8];
  string file_name_Y;
  ostringstream local_228 [8];
  ostringstream oss;
  __cxx11 local_b0 [8];
  string min;
  __cxx11 local_90 [8];
  string hour;
  int year;
  __cxx11 local_60 [8];
  string month;
  __cxx11 local_40 [8];
  string day;
  tm *aTime;
  time_t theTime;
  bool perspectiveCorrection_local;
  
  theTime._7_1_ = perspectiveCorrection;
  aTime = (tm *)time((time_t *)0x0);
  ptVar5 = localtime((time_t *)&aTime);
  std::__cxx11::to_string(local_40,ptVar5->tm_mday);
  std::__cxx11::to_string(local_60,ptVar5->tm_mon + 1);
  iVar4 = ptVar5->tm_year + 0x76c;
  std::__cxx11::to_string(local_90,ptVar5->tm_hour);
  std::__cxx11::to_string(local_b0,ptVar5->tm_min);
  std::__cxx11::ostringstream::ostringstream(local_228);
  lVar6 = std::__cxx11::string::length();
  if (lVar6 == 1) {
    poVar7 = std::operator<<((ostream *)local_228,"../PendulumCsv/");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    poVar7 = std::operator<<(poVar7,"_0");
    std::operator<<(poVar7,(string *)local_60);
  }
  else {
    poVar7 = std::operator<<((ostream *)local_228,"../PendulumCsv/");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar4);
    poVar7 = std::operator<<(poVar7,"_");
    std::operator<<(poVar7,(string *)local_60);
  }
  lVar6 = std::__cxx11::string::length();
  if (lVar6 == 1) {
    poVar7 = std::operator<<((ostream *)local_228,"_0");
    std::operator<<(poVar7,(string *)local_40);
  }
  else {
    poVar7 = std::operator<<((ostream *)local_228,"_");
    std::operator<<(poVar7,(string *)local_40);
  }
  lVar6 = std::__cxx11::string::length();
  if (lVar6 == 1) {
    poVar7 = std::operator<<((ostream *)local_228,"_0");
    std::operator<<(poVar7,(string *)local_90);
  }
  else {
    poVar7 = std::operator<<((ostream *)local_228,"_");
    std::operator<<(poVar7,(string *)local_90);
  }
  lVar6 = std::__cxx11::string::length();
  if (lVar6 == 1) {
    poVar7 = std::operator<<((ostream *)local_228,"_0");
    std::operator<<(poVar7,(string *)local_b0);
  }
  else {
    poVar7 = std::operator<<((ostream *)local_228,"_");
    std::operator<<(poVar7,(string *)local_b0);
  }
  std::__cxx11::string::string(local_248);
  std::__cxx11::string::string(local_268);
  if ((theTime._7_1_ & 1) == 0) {
    std::operator<<((ostream *)local_228,"_N.csv");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_268,local_2a8);
    std::__cxx11::string::~string(local_2a8);
  }
  else {
    std::operator<<((ostream *)local_228,"_Y.csv");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(local_248,local_288);
    std::__cxx11::string::~string(local_288);
  }
  std::ofstream::ofstream(local_4a8,local_268,_S_out);
  bVar3 = std::ofstream::is_open();
  if ((bVar3 & 1) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Opened file ");
    poVar7 = std::operator<<(poVar7,local_268);
    std::operator<<(poVar7,"\n");
  }
  std::ofstream::ofstream(local_6a8,local_248,_S_out);
  bVar3 = std::ofstream::is_open();
  if ((bVar3 & 1) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Opened file ");
    poVar7 = std::operator<<(poVar7,local_248);
    std::operator<<(poVar7,"\n");
  }
  std::operator<<(local_4a8,"time;x;y\n");
  std::operator<<(local_6a8,"time;x;y\n");
  elapsed_X._4_4_ = 0xffffffff;
  pos_X = -1.0;
  cv::Mat::Mat((Mat *)&lastPoint.y);
  cv::Point_<double>::Point_((Point_<double> *)local_740);
  cv::namedWindow((string *)image_window_abi_cxx11_,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_760,"Show graph",&local_761);
  cv::createButton(local_760,toggleView,(void *)0x0,1,false);
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_788,"Number of graph points",(allocator *)((long)&new_position_x + 7));
  cv::createTrackbar(local_788,(string *)image_window_abi_cxx11_,ptrGraphPoints,1000,checkTrackbar,
                     (void *)0x0);
  std::__cxx11::string::~string(local_788);
  std::allocator<char>::~allocator((allocator<char> *)((long)&new_position_x + 7));
  last[2]._4_4_ = 0;
  sumTheta = 0.0;
  _maxNum = 0.0;
  Rgood = 0.0;
  lock._12_4_ = 0x42c80000;
  do {
    while( true ) {
      dVar2 = current[1];
      dVar15 = next[0];
      pdVar1 = lastMax;
      if (expectedFrameNumber % 2 == 0) {
        std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_848,&requestA.mx)
        ;
        std::condition_variable::wait<writeFile(bool)::__0>(&requestA.cv,local_848);
        local_6d0 = &resultQueue_A;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_848);
      }
      else {
        std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_860,&requestB.mx)
        ;
        std::condition_variable::wait<writeFile(bool)::__1>(&requestB.cv,local_860);
        local_6d0 = &resultQueue_B;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_860);
      }
      __in = std::
             queue<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::deque<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>_>
             ::front(local_6d0);
      std::tie<cv::Mat,int,double,double,double>
                ((tuple<cv::Mat_&,_int_&,_double_&,_double_&,_double_&> *)&xx,(Mat *)&lastPoint.y,
                 (int *)((long)&elapsed_X + 4),&pos_X,&pos_Y,(double *)&resultQueue_X);
      std::tuple<cv::Mat&,int&,double&,double&,double&>::operator=
                ((tuple<cv::Mat&,int&,double&,double&,double&> *)&xx,__in);
      std::
      queue<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::deque<std::tuple<cv::Mat,_int,_double,_double,_double>,_std::allocator<std::tuple<cv::Mat,_int,_double,_double,_double>_>_>_>
      ::pop(local_6d0);
      if ((theTime._7_1_ & 1) != 0) {
        dVar9 = myMatrix[0][0] * pos_Y + myMatrix[0][1] * (double)resultQueue_X + myMatrix[0][2];
        dVar10 = myMatrix[2][0] * pos_Y + myMatrix[2][1] * (double)resultQueue_X + myMatrix[2][2];
        dVar11 = myMatrix[1][0] * pos_Y + myMatrix[1][1] * (double)resultQueue_X + myMatrix[1][2];
        dVar12 = myMatrix[2][0] * pos_Y + myMatrix[2][1] * (double)resultQueue_X + myMatrix[2][2];
        poVar7 = (ostream *)std::ostream::operator<<(local_6a8,std::fixed);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pos_X);
        poVar7 = std::operator<<(poVar7,";");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)(dVar9 / dVar10));
        poVar7 = std::operator<<(poVar7,";");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)(dVar11 / dVar12));
        std::operator<<(poVar7,"\n");
        std::ostream::flush();
      }
      poVar7 = (ostream *)std::ostream::operator<<(local_4a8,std::fixed);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pos_X);
      poVar7 = std::operator<<(poVar7,";");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)pos_Y);
      poVar7 = std::operator<<(poVar7,";");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)(double)resultQueue_X);
      std::operator<<(poVar7,"\n");
      std::ostream::flush();
      expectedFrameNumber = expectedFrameNumber + 1;
      yy = pos_Y - 319.7900085449219;
      rr = (double)resultQueue_X - 245.0;
      _Var13 = std::pow<double,int>(yy,2);
      _Var14 = std::pow<double,int>(rr,2);
      dVar9 = sqrt(_Var13 + _Var14);
      lastMax = (double *)yy;
      next[0] = rr;
      theta = dVar9;
      if (last[2]._4_4_ != 0) break;
LAB_00108647:
      last[2]._4_4_ = last[2]._4_4_ + 1;
      cv::Point_<double>::Point_(&local_8c0,pos_Y,(double)resultQueue_X);
      std::
      queue<cv::Point_<double>,_std::deque<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>_>
      ::push(&pointsVector,&local_8c0);
      cv::_InputOutputArray::_InputOutputArray(&local_8d8,(Mat *)plot_image);
      cv::Point_<double>::Point_(&local_8f0,pos_Y,(double)resultQueue_X);
      cv::Point_::operator_cast_to_Point_(local_8e0);
      cv::Point_<double>::Point_(&local_908,pos_Y,(double)resultQueue_X);
      cv::Point_::operator_cast_to_Point_(local_8f8);
      cv::Scalar_<double>::Scalar_(&local_928,0.0,0.0,0.0,0.0);
      cv::line(&local_8d8,local_8e0,local_8f8,&local_928,1,8,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_8d8);
      sVar8 = std::
              queue<cv::Point_<double>,_std::deque<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>_>
              ::size(&pointsVector);
      if ((ulong)(long)graphPoints <= sVar8) {
        while (sVar8 = std::
                       queue<cv::Point_<double>,_std::deque<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>_>
                       ::size(&pointsVector), (ulong)(long)graphPoints < sVar8) {
          pt = std::
               queue<cv::Point_<double>,_std::deque<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>_>
               ::front(&pointsVector);
          cv::Point_<double>::operator=((Point_<double> *)local_740,pt);
          cv::_InputOutputArray::_InputOutputArray(&local_940,(Mat *)plot_image);
          cv::Point_::operator_cast_to_Point_(local_948);
          cv::Point_::operator_cast_to_Point_(local_950);
          cv::Scalar_<double>::Scalar_(&local_970,255.0,255.0,255.0,0.0);
          cv::line(&local_940,local_948,local_950,&local_970,1,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_940);
          std::
          queue<cv::Point_<double>,_std::deque<cv::Point_<double>,_std::allocator<cv::Point_<double>_>_>_>
          ::pop(&pointsVector);
        }
      }
      if ((is_graph_activated & 1U) == 0) {
        cv::_InputArray::_InputArray(&local_9a0,(Mat *)&lastPoint.y);
        cv::imshow((string *)image_window_abi_cxx11_,&local_9a0);
        cv::_InputArray::~_InputArray(&local_9a0);
      }
      else {
        cv::_InputArray::_InputArray(&local_988,(Mat *)plot_image);
        cv::imshow((string *)image_window_abi_cxx11_,&local_988);
        cv::_InputArray::~_InputArray(&local_988);
      }
      cv::waitKey(1);
      next[1] = dVar9;
    }
    if (last[2]._4_4_ == 1) {
LAB_00108645:
      current[1] = next[1];
      goto LAB_00108647;
    }
    current[1] = next[1];
    if (((next[1] <= dVar2) || (next[1] < dVar9)) || (next[1] <= (double)(float)lock._12_4_))
    goto LAB_00108645;
    if (sumTheta != 0.0) {
      if (((double)pdVar1 - *(double *)sumTheta != 0.0) ||
         (NAN((double)pdVar1 - *(double *)sumTheta))) {
        dVar15 = atan((dVar15 - *(double *)((long)sumTheta + 8)) /
                      ((double)pdVar1 - *(double *)sumTheta));
        local_8b0 = (dVar15 * 180.0) / 3.14159265;
      }
      else {
        local_8b0 = 90.0;
      }
      if (local_8b0 < 0.0) {
        local_8b0 = local_8b0 + 180.0;
      }
      if (Rgood == 1.4013e-44) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Elapsed time: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::fixed);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pos_X);
        poVar7 = std::operator<<(poVar7,", angle: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,_maxNum / 10.0);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        _maxNum = local_8b0;
        Rgood = 1.4013e-45;
      }
      else {
        _maxNum = local_8b0 + _maxNum;
        Rgood = (float)((int)Rgood + 1);
      }
      sumTheta = 0.0;
      goto LAB_00108645;
    }
    sumTheta = (double)operator_new__(0x18);
    *(double **)sumTheta = pdVar1;
    *(double *)((long)sumTheta + 8) = dVar15;
    *(double *)((long)sumTheta + 0x10) = next[1];
    next[1] = dVar9;
  } while( true );
}

Assistant:

[[noreturn]] void writeFile(const bool perspectiveCorrection){

    time_t theTime = time(NULL);
    struct tm *aTime = localtime(&theTime);

    /// Getting the current time
    string day = std::to_string(aTime->tm_mday);
    string month = std::to_string(aTime->tm_mon + 1); // Month is 0 - 11, add 1 to get a jan-dec 1-12
    int year = aTime->tm_year + 1900; // Year is # years since 1900
    string hour = std::to_string(aTime->tm_hour);
    string min = std::to_string(aTime->tm_min);

    /// Setting the right name for the file that will store the centers positions
    /// Y means "yes perspective correction"
    std::ostringstream oss;
    // adding 0 in front if necessary to always have a name of the form XXXX_XX_XX_XX_XX_N.csv
    if (month.length()==1){
        // add a front 0 to the month
        oss << "../PendulumCsv/" <<year<<"_0"<<month;
    }else{
        oss << "../PendulumCsv/" <<year<<"_"<<month;
    }
    if(day.length()==1){
        oss<<"_0"<<day;
    }else{
        oss<<"_"<<day;
    }
    if(hour.length()==1){
        oss<<"_0"<<hour;
    }else{
        oss<<"_"<<hour;
    }
    if(min.length()==1){
        oss<<"_0"<<min;
    }else{
        oss<<"_"<<min;
    }
    std::string file_name_Y;
    std::string file_name;
    if(perspectiveCorrection){
        oss<<"_Y.csv";
        file_name_Y = oss.str();
    }else{
        oss<<"_N.csv";
        file_name = oss.str();
    }

    /// Opening the file where will be saved the coordinates of centers on each frame
    ofstream txt_file (file_name);
    if (txt_file.is_open())
        cout << "Opened file "<< file_name<<"\n";

    ofstream txt_file_Y (file_name_Y);
    if (txt_file_Y.is_open())
        cout << "Opened file "<< file_name_Y<<"\n";

    txt_file <<"time;x;y\n";
    txt_file_Y <<"time;x;y\n";

    int frameNumber_X=-1;
    double elapsed_X=-1.0;
    double pos_X;
    double pos_Y;
    std::queue<tuple<Mat, int, double, double, double>> *resultQueue_X;
    Mat extracted_Mat_X;
    Point2d lastPoint;

    namedWindow(image_window,WINDOW_GUI_EXPANDED);
    createButton("Show graph", toggleView, NULL, QT_CHECKBOX, 0);
    createTrackbar("Number of graph points",image_window, ptrGraphPoints,1000,checkTrackbar,NULL);


    // variables for the perspective
    double new_position_x;
    double new_position_y;
    double num;
    double dem;

    // variables for computing angle
    float xCenter= 319.79;
    float yCenter= 245.00;
    // npts is the total number of points
    int npts=0;
    // number of maximum
    int Nmassi = 0;

    // last, current and next elements to evaluate. Each array has the form [x, y, radius].
    double last[3];
    double current[3];
    double next[3];
    double* lastMax = nullptr;

    double sumTheta=0;
    int innerCountMax = 0;
    // mean over maxNum of pair of maximum for theta
    int maxNum=10;
    //std::cout<<"Mean of theta over "<<maxNum*2<<" maximum"<<std::endl;

    float Rgood = 100;

    while(true){

        // checking if the expected frame number is even or odd (if even we extract from the resultQueue_A, if
        // odd from the resultQueue_B)
        if (expectedFrameNumber % 2 ==0){
            //waiting until some elements is added to the queue of results
            std::unique_lock<std::mutex> lock(requestA.mx);
            requestA.cv.wait(lock, []{return !resultQueue_A.empty();});
            resultQueue_X = &resultQueue_A;
        }else{
            //waiting until some elements is added to the queue of results
            std::unique_lock<std::mutex> lock(requestB.mx);
            requestB.cv.wait(lock, []{return !resultQueue_B.empty();});
            resultQueue_X = &resultQueue_B;
        }

        //a frame has been added to the queue we were waiting for, now we can extract the desired frame and related variables
        tie(extracted_Mat_X, frameNumber_X, elapsed_X, pos_X, pos_Y) = resultQueue_X->front();

        resultQueue_X->pop();

        /// Perspective adjustments, only if required by the user
        if(perspectiveCorrection) {
            num = myMatrix[0][0] * pos_X + myMatrix[0][1] * pos_Y + myMatrix[0][2];
            dem = myMatrix[2][0] * pos_X + myMatrix[2][1] * pos_Y + myMatrix[2][2];

            new_position_x = num / dem;
            num = myMatrix[1][0] * pos_X + myMatrix[1][1] * pos_Y + myMatrix[1][2];
            dem = myMatrix[2][0] * pos_X + myMatrix[2][1] * pos_Y + myMatrix[2][2];
            new_position_y = num / dem;
            txt_file_Y << fixed << elapsed_X << ";" << (int)(new_position_x) << ";" << (int)(new_position_y) << "\n";
            txt_file_Y.flush();
        }
        /// saving to txt the positions found in MatchingMethod

        txt_file << fixed << elapsed_X << ";" << (int)(pos_X) << ";" << (int)(pos_Y) << "\n";
        txt_file.flush();
        // incrementing the expectedFrameNumber because we handled the frame and we can pass to the later one
        expectedFrameNumber++;


        /// computing the angle
        // - time is the current time
        // - xx is the x coordinate obtained from (x coord - xCenter)
        // - yy is the y coordinate obtained from (y coord - yCenter)
        // - rr is the radius obtained from sqrt(xx^2+yy^2)
        double xx = pos_X-xCenter;
        double yy = pos_Y-yCenter;
        double rr = sqrt(pow(xx, 2) + pow(yy, 2));

        if(npts == 0){
            next[0]=xx;
            next[1]=yy;
            next[2]=rr;
        }else if(npts==1){
            current[0]=next[0];
            current[1]=next[1];
            current[2]=next[2];
            next[0]=xx;
            next[1]=yy;
            next[2]=rr;
        }else{
            last[0]=current[0];
            last[1]=current[1];
            last[2]=current[2];
            current[0]=next[0];
            current[1]=next[1];
            current[2]=next[2];
            next[0]=xx;
            next[1]=yy;
            next[2]=rr;

            if ((current[2] > last[2]) && (current[2] >= next[2]) && (current[2] > Rgood)){
                // found a new maximum
                Nmassi++;
                // we evaluate the maximums two by two
                if(lastMax == nullptr){ //checks the size of the array. If the size is zero
                    lastMax = new double[3];
                    // this is the first of the couple to evaluate
                    lastMax[0]=current[0];
                    lastMax[1]=current[1];
                    lastMax[2]=current[2];
                    continue;
                }

                // use the consecutive maximum coordinates to obtain theta:
                // arctan((y_current - y_last)/(x_current - x_last))
                double theta;

                if ((current[0] - lastMax[0])==0){
                    // making sure that the denominator is not 0, and if so the arctan is 90 degrees
                    theta=90;
                }else{
                    theta = atan((current[1] - lastMax[1])/(current[0] - lastMax[0])) *180 / PI; // arctan in degrees
                }
                if (theta < 0){
                    theta = theta + 180;
                }

                // theta is shown averaged over maxNum consecutive maxima
                if(innerCountMax==maxNum){
                    sumTheta=sumTheta/maxNum;
                    std::cout << "Elapsed time: "<< fixed << elapsed_X <<", angle: " << sumTheta << std::endl;
                    sumTheta=theta;
                    innerCountMax=1;
                }else{
                    sumTheta+=theta;
                    innerCountMax++;
                }

                // we evaluated two max
                lastMax = nullptr;
            }
        }
        npts++;

        /// we add the OLD point to the pointsVector to be shown on plot_image Mat
        pointsVector.push(Point2d(pos_X,pos_Y));
        /// we start displaying the points
        cv::line(plot_image, Point2d(pos_X,pos_Y), Point2d(pos_X,pos_Y), cv::Scalar(0,0,0), 1);

        /// we want to display in the graph no more than 30 points. The 30th point is discarded by coloring it white
        if (pointsVector.size()>=graphPoints){
            while(pointsVector.size()>graphPoints){
                lastPoint = pointsVector.front();
                cv::line(plot_image, lastPoint, lastPoint, cv::Scalar(255,255,255), 1);
                pointsVector.pop();
            }
        }
        if(is_graph_activated)
            imshow(image_window, plot_image);
        else
            imshow(image_window, extracted_Mat_X);

        waitKey(1);
    }
}